

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void srclistRenumberCursors(Parse *pParse,int *aCsrMap,SrcList *pSrc,int iExcept)

{
  int iVar1;
  ushort uVar2;
  int iVar3;
  Select *pSVar4;
  int iVar5;
  SrcItem *pSVar6;
  
  if (0 < pSrc->nSrc) {
    pSVar6 = pSrc->a;
    iVar5 = 0;
    do {
      if (iVar5 != iExcept) {
        uVar2 = *(ushort *)&(pSVar6->fg).field_0x1;
        iVar1 = pSVar6->iCursor;
        if ((-1 < (char)uVar2) || (iVar3 = aCsrMap[(long)iVar1 + 1], iVar3 == 0)) {
          iVar3 = pParse->nTab;
          pParse->nTab = iVar3 + 1;
          aCsrMap[(long)iVar1 + 1] = iVar3;
          iVar3 = aCsrMap[(long)pSVar6->iCursor + 1];
          uVar2 = *(ushort *)&(pSVar6->fg).field_0x1;
        }
        pSVar6->iCursor = iVar3;
        if ((uVar2 & 4) != 0) {
          for (pSVar4 = ((pSVar6->u4).pSubq)->pSelect; pSVar4 != (Select *)0x0;
              pSVar4 = pSVar4->pPrior) {
            srclistRenumberCursors(pParse,aCsrMap,pSVar4->pSrc,-1);
          }
        }
      }
      iVar5 = iVar5 + 1;
      pSVar6 = pSVar6 + 1;
    } while (iVar5 < pSrc->nSrc);
  }
  return;
}

Assistant:

static void srclistRenumberCursors(
  Parse *pParse,                  /* Parse context */
  int *aCsrMap,                   /* Array to store cursor mappings in */
  SrcList *pSrc,                  /* FROM clause to renumber */
  int iExcept                     /* FROM clause item to skip */
){
  int i;
  SrcItem *pItem;
  for(i=0, pItem=pSrc->a; i<pSrc->nSrc; i++, pItem++){
    if( i!=iExcept ){
      Select *p;
      assert( pItem->iCursor < aCsrMap[0] );
      if( !pItem->fg.isRecursive || aCsrMap[pItem->iCursor+1]==0 ){
        aCsrMap[pItem->iCursor+1] = pParse->nTab++;
      }
      pItem->iCursor = aCsrMap[pItem->iCursor+1];
      if( pItem->fg.isSubquery ){
        for(p=pItem->u4.pSubq->pSelect; p; p=p->pPrior){
          srclistRenumberCursors(pParse, aCsrMap, p->pSrc, -1);
        }
      }
    }
  }
}